

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void isoent_setup_directory_location(iso9660_conflict *iso9660,int location,vdd *vdd)

{
  int iVar1;
  int iVar2;
  undefined8 *in_RDX;
  uint32_t in_ESI;
  int block;
  int depth;
  isoent *np;
  undefined4 in_stack_00000018;
  int local_24;
  isoent *local_20;
  uint32_t local_c;
  
  *(undefined4 *)((long)in_RDX + 0x2c) = 0;
  local_24 = 0;
  local_20 = (isoent *)*in_RDX;
  local_c = in_ESI;
  do {
    iVar1 = calculate_directory_descriptors
                      ((iso9660_conflict *)CONCAT44(location,in_stack_00000018),vdd,np,depth);
    local_20->dir_block = iVar1;
    *(int *)((long)in_RDX + 0x2c) = local_20->dir_block + *(int *)((long)in_RDX + 0x2c);
    local_20->dir_location = local_c;
    iVar1 = local_20->dir_block + local_c;
    iVar2 = extra_setup_location(local_20,iVar1);
    *(int *)((long)in_RDX + 0x2c) = iVar2 + *(int *)((long)in_RDX + 0x2c);
    local_c = iVar2 + iVar1;
    if (((local_20->subdirs).first == (isoent *)0x0) || (*(int *)(in_RDX + 3) <= local_24 + 1)) {
      for (; local_20 != local_20->parent; local_20 = local_20->parent) {
        if (local_20->drnext != (isoent *)0x0) {
          local_20 = local_20->drnext;
          break;
        }
        local_24 = local_24 + -1;
      }
    }
    else {
      local_20 = (local_20->subdirs).first;
      local_24 = local_24 + 1;
    }
    if (local_20 == local_20->parent) {
      return;
    }
  } while( true );
}

Assistant:

static void
isoent_setup_directory_location(struct iso9660 *iso9660, int location,
    struct vdd *vdd)
{
	struct isoent *np;
	int depth;

	vdd->total_dir_block = 0;
	depth = 0;
	np = vdd->rootent;
	do {
		int block;

		np->dir_block = calculate_directory_descriptors(
		    iso9660, vdd, np, depth);
		vdd->total_dir_block += np->dir_block;
		np->dir_location = location;
		location += np->dir_block;
		block = extra_setup_location(np, location);
		vdd->total_dir_block += block;
		location += block;

		if (np->subdirs.first != NULL && depth + 1 < vdd->max_depth) {
			/* Enter to sub directories. */
			np = np->subdirs.first;
			depth++;
			continue;
		}
		while (np != np->parent) {
			if (np->drnext == NULL) {
				/* Return to the parent directory. */
				np = np->parent;
				depth--;
			} else {
				np = np->drnext;
				break;
			}
		}
	} while (np != np->parent);
}